

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSubscribe(UpnpClient_Handle Hnd,char *EvtUrl_const,int *TimeOut,char *SubsId)

{
  char *__dest;
  Upnp_Handle_Type UVar1;
  UpnpString *p;
  UpnpString *p_00;
  char *__src;
  UpnpString *SubsIdTmp;
  UpnpString *EvtUrl;
  Handle_Info *SInfo;
  char *pcStack_28;
  int retVal;
  char *SubsId_local;
  int *TimeOut_local;
  char *EvtUrl_const_local;
  UpnpClient_Handle Hnd_local;
  
  EvtUrl = (UpnpString *)0x0;
  pcStack_28 = SubsId;
  SubsId_local = (char *)TimeOut;
  TimeOut_local = (int *)EvtUrl_const;
  EvtUrl_const_local._4_4_ = Hnd;
  p = UpnpString_new();
  p_00 = UpnpString_new();
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x8e5,"Inside UpnpSubscribe\n");
  if (UpnpSdkInit == 1) {
    if (p == (UpnpString *)0x0) {
      SInfo._4_4_ = 0xffffff98;
    }
    else if (TimeOut_local == (int *)0x0) {
      SInfo._4_4_ = 0xffffff9b;
    }
    else {
      UpnpString_set_String(p,(char *)TimeOut_local);
      if (p_00 == (UpnpString *)0x0) {
        SInfo._4_4_ = 0xffffff98;
      }
      else if (pcStack_28 == (char *)0x0) {
        SInfo._4_4_ = 0xffffff9b;
      }
      else {
        UpnpString_set_String(p_00,pcStack_28);
        if (SubsId_local == (char *)0x0) {
          SInfo._4_4_ = 0xffffff9b;
        }
        else {
          HandleReadLock(".upnp/src/api/upnpapi.c",0x905);
          UVar1 = GetHandleInfo(EvtUrl_const_local._4_4_,(Handle_Info **)&EvtUrl);
          if (UVar1 == HND_CLIENT) {
            HandleUnlock(".upnp/src/api/upnpapi.c",0x90e);
            SInfo._4_4_ = genaSubscribe(EvtUrl_const_local._4_4_,p,(int *)SubsId_local,p_00);
            memset(pcStack_28,0,0x2c);
            __dest = pcStack_28;
            __src = UpnpString_get_String(p_00);
            strncpy(__dest,__src,0x2b);
          }
          else {
            HandleUnlock(".upnp/src/api/upnpapi.c",0x90a);
            SInfo._4_4_ = 0xffffff9c;
          }
        }
      }
    }
  }
  else {
    SInfo._4_4_ = 0xffffff8c;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x918,"Exiting UpnpSubscribe, retVal=%d\n",
             (ulong)SInfo._4_4_);
  UpnpString_delete(p_00);
  UpnpString_delete(p);
  return SInfo._4_4_;
}

Assistant:

int UpnpSubscribe(UpnpClient_Handle Hnd,
	const char *EvtUrl_const,
	int *TimeOut,
	Upnp_SID SubsId)
{
	int retVal;
	struct Handle_Info *SInfo = NULL;
	UpnpString *EvtUrl = UpnpString_new();
	UpnpString *SubsIdTmp = UpnpString_new();

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSubscribe\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (EvtUrl == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (EvtUrl_const == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(EvtUrl, EvtUrl_const);

	if (SubsIdTmp == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(SubsIdTmp, SubsId);

	if (TimeOut == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	retVal = genaSubscribe(Hnd, EvtUrl, TimeOut, SubsIdTmp);
	memset(SubsId, 0, sizeof(Upnp_SID));
	strncpy(SubsId, UpnpString_get_String(SubsIdTmp), sizeof(Upnp_SID) - 1);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSubscribe, retVal=%d\n",
		retVal);

	UpnpString_delete(SubsIdTmp);
	UpnpString_delete(EvtUrl);

	return retVal;
}